

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::releaseExclusivePublication(ClientConductor *this,int64_t registrationId)

{
  pointer pEVar1;
  int iVar2;
  pointer pEVar3;
  long lVar4;
  long lVar5;
  iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pEVar3 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pEVar1 - (long)pEVar3;
  lVar4 = (lVar5 >> 4) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar4) {
    lVar5 = lVar4 + 1;
    __position._M_current = pEVar3 + 2;
    do {
      if (__position._M_current[-2].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -2;
        goto LAB_00140bdd;
      }
      if (__position._M_current[-1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -1;
        goto LAB_00140bdd;
      }
      if ((__position._M_current)->m_registrationId == registrationId) goto LAB_00140bdd;
      if (__position._M_current[1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00140bdd;
      }
      lVar5 = lVar5 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar5);
    lVar5 = (long)pEVar1 - (long)(pEVar3 + lVar4 * 4);
    pEVar3 = pEVar3 + lVar4 * 4;
  }
  lVar4 = (lVar5 >> 4) * -0x71c71c71c71c71c7;
  if (lVar4 == 1) {
LAB_00140bb7:
    __position._M_current = pEVar3;
    if (pEVar3->m_registrationId != registrationId) {
      __position._M_current = pEVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_00140baa:
    __position._M_current = pEVar3;
    if (pEVar3->m_registrationId != registrationId) {
      pEVar3 = pEVar3 + 1;
      goto LAB_00140bb7;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_00140c00;
    __position._M_current = pEVar3;
    if (pEVar3->m_registrationId != registrationId) {
      pEVar3 = pEVar3 + 1;
      goto LAB_00140baa;
    }
  }
LAB_00140bdd:
  if (__position._M_current != pEVar1) {
    DriverProxy::removePublication(this->m_driverProxy,registrationId);
    std::
    vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
    ::_M_erase(&this->m_exclusivePublications,__position);
  }
LAB_00140c00:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseExclusivePublication(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [registrationId](const ExclusivePublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it != m_exclusivePublications.end())
    {
        m_driverProxy.removePublication(registrationId);
        m_exclusivePublications.erase(it);
    }
}